

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_addl_saturate_s32_arm(CPUARMState *env,uint64_t a,uint64_t b)

{
  uint uVar1;
  uint uVar2;
  uint local_30;
  uint local_2c;
  uint32_t high;
  uint32_t low;
  uint32_t y;
  uint32_t x;
  uint64_t b_local;
  uint64_t a_local;
  CPUARMState *env_local;
  
  uVar1 = (uint)a;
  local_2c = uVar1 + (uint)b;
  if ((((local_2c ^ uVar1) & 0x80000000) != 0) && (((uVar1 ^ (uint)b) & 0x80000000) == 0)) {
    (env->vfp).qc[0] = 1;
    local_2c = (int)uVar1 >> 0x1f ^ 0x7fffffff;
  }
  uVar1 = (uint)(a >> 0x20);
  uVar2 = (uint)(b >> 0x20);
  local_30 = uVar1 + uVar2;
  if ((((local_30 ^ uVar1) & 0x80000000) != 0) && (((uVar1 ^ uVar2) & 0x80000000) == 0)) {
    (env->vfp).qc[0] = 1;
    local_30 = (int)uVar1 >> 0x1f ^ 0x7fffffff;
  }
  return CONCAT44(local_30,local_2c);
}

Assistant:

uint64_t HELPER(neon_addl_saturate_s32)(CPUARMState *env, uint64_t a, uint64_t b)
{
    uint32_t x, y;
    uint32_t low, high;

    x = a;
    y = b;
    low = x + y;
    if (((low ^ x) & SIGNBIT) && !((x ^ y) & SIGNBIT)) {
        SET_QC();
        low = ((int32_t)x >> 31) ^ ~SIGNBIT;
    }
    x = a >> 32;
    y = b >> 32;
    high = x + y;
    if (((high ^ x) & SIGNBIT) && !((x ^ y) & SIGNBIT)) {
        SET_QC();
        high = ((int32_t)x >> 31) ^ ~SIGNBIT;
    }
    return low | ((uint64_t)high << 32);
}